

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O2

void __thiscall UCAFL::_may_use_mmap_testcase(UCAFL *this)

{
  int __fd;
  int iVar1;
  uint32_t *puVar2;
  char *__s;
  stat st;
  
  memset(&st,0,0x90);
  if (this->afl_use_shm_testcase_ != false) {
    return;
  }
  this->afl_testcase_len_p_ = &this->afl_testcase_len_;
  __fd = open(this->input_file_,0);
  iVar1 = fstat(__fd,(stat *)&st);
  if (iVar1 == 0) {
    puVar2 = (uint32_t *)mmap((void *)0x0,st.st_size,3,2,__fd,0);
    this->afl_testcase_ptr_ = puVar2;
    if (puVar2 != (uint32_t *)0xffffffffffffffff) {
      this->afl_testcase_len_ = (uint32_t)st.st_size;
      close(__fd);
      return;
    }
    __s = "[!] Fail to mmap testcase.";
  }
  else {
    __s = "[!] Fail to stat.";
  }
  perror(__s);
  exit(1);
}

Assistant:

void _may_use_mmap_testcase() {
        off_t ret;
        struct stat st = {0};

        if (unlikely(!this->afl_use_shm_testcase_)) {
            this->afl_testcase_len_p_ = &this->afl_testcase_len_;
            int fd = open(this->input_file_, O_RDONLY);

            if (fstat(fd, &st)) {
                perror("[!] Fail to stat.");
                exit(1);
            }

            this->afl_testcase_ptr_ = (uint32_t*)mmap(
                NULL, st.st_size, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, 0);

            if (this->afl_testcase_ptr_ == MAP_FAILED) {
                perror("[!] Fail to mmap testcase.");
                exit(1);
            }

            this->afl_testcase_len_ = (uint32_t)st.st_size;

            close(fd);
        }
    }